

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
* phmap::priv::
  btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  ::init_leaf(btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
              *n,btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                 *parent,int max_cnt)

{
  template_ElementType<1UL> *ptVar1;
  
  set_parent(n,parent);
  ptVar1 = btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
           ::GetField<1ul>((btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                            *)n);
  *ptVar1 = '\0';
  ptVar1 = btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
           ::GetField<1ul>((btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                            *)n);
  ptVar1[1] = '\0';
  ptVar1 = btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
           ::GetField<1ul>((btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                            *)n);
  ptVar1[2] = '\0';
  ptVar1 = btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
           ::GetField<1ul>((btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                            *)n);
  ptVar1[3] = (template_ElementType<1UL>)max_cnt;
  slot(n,0);
  return n;
}

Assistant:

static btree_node *init_leaf(btree_node *n, btree_node *parent,
                                     int max_cnt) {
            n->set_parent(parent);
            n->set_position(0);
            n->set_start(0);
            n->set_count(0);
            n->set_max_count((field_type)max_cnt);
            phmap::priv::SanitizerPoisonMemoryRegion(
                n->slot(0), max_cnt * sizeof(slot_type));
            return n;
        }